

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O3

float Nwl_ManComputeTotalSwitching(Nwk_Man_t *pNtk)

{
  int *__ptr;
  void *pvVar1;
  Aig_Man_t *pAig;
  Vec_Int_t *__ptr_00;
  long lVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  
  pAig = Nwk_ManStrash(pNtk);
  __ptr_00 = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,0);
  __ptr = __ptr_00->pArray;
  lVar2 = (long)pNtk->vObjs->nSize;
  if (lVar2 < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    lVar3 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) &&
         (uVar4 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe, uVar4 != 0)) {
        fVar5 = fVar5 + (float)*(int *)((long)pvVar1 + 0x40) * (float)__ptr[*(int *)(uVar4 + 0x24)];
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(__ptr_00);
  Aig_ManStop(pAig);
  return fVar5;
}

Assistant:

float Nwl_ManComputeTotalSwitching( Nwk_Man_t * pNtk )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Nwk_Obj_t * pObjAbc;
    float Result = (float)0;
    int i;
    // strash the network
    // map network into an AIG
    pAig = Nwk_ManStrash( pNtk );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Nwk_ManForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc->pCopy)) )
            Result += Nwk_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    return Result;
}